

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

const_iterator __thiscall
spvtools::opt::analysis::DefUseManager::UsersBegin(DefUseManager *this,Instruction *def)

{
  const_iterator cVar1;
  key_type local_10;
  
  local_10.user = (Instruction *)0x0;
  local_10.def = def;
  cVar1 = std::
          _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
          ::lower_bound(&(this->id_to_users_)._M_t,&local_10);
  return (const_iterator)cVar1._M_node;
}

Assistant:

DefUseManager::IdToUsersMap::const_iterator DefUseManager::UsersBegin(
    const Instruction* def) const {
  return id_to_users_.lower_bound(
      UserEntry{const_cast<Instruction*>(def), nullptr});
}